

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingFundamentals.cpp
# Opt level: O0

void logSigned<int>(void)

{
  Severity SVar1;
  cx_string<4UL> cVar2;
  SessionWriter *pSVar3;
  uint64_t _binlog_sid_v;
  int *c;
  int b;
  int a;
  memory_order __b;
  memory_order __b_1;
  EventSource *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe28;
  int *in_stack_fffffffffffffe30;
  __atomic_base<unsigned_long> clock;
  atomic<unsigned_long> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  EventSource *in_stack_fffffffffffffe48;
  Session *in_stack_fffffffffffffe50;
  allocator *in_stack_fffffffffffffe58;
  int local_134;
  undefined1 local_12d;
  undefined1 local_12c;
  undefined1 local_12b;
  undefined1 local_12a;
  allocator local_129;
  undefined4 local_128;
  cx_string<4UL> local_124;
  allocator local_11f;
  allocator local_11e;
  allocator local_11d [20];
  allocator local_109;
  undefined8 local_108;
  undefined2 local_100;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  undefined8 local_98;
  string local_90 [32];
  string local_70 [32];
  __atomic_base<unsigned_long> local_50;
  int *local_48;
  int local_40 [2];
  __atomic_base<unsigned_long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __int_type local_10;
  atomic<unsigned_long> *local_8;
  
  local_40[1] = 0xffffffec;
  local_40[0] = 0x1e;
  local_48 = local_40;
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar1 = binlog::Session::minSeverity((Session *)0x1038d2);
  if (SVar1 < 0x81) {
    local_28 = &logSigned<int>::_binlog_sid;
    local_2c = 0;
    local_30 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_38 = logSigned<int>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_50 = logSigned<int>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (logSigned<int>::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_108 = 0;
      local_100 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"main",&local_109);
      local_12d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"logSigned",local_11d);
      local_12c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingFundamentals.cpp"
                 ,&local_11e);
      local_12b = 1;
      local_98 = 0xc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"{} {} {} {}",&local_11f);
      local_12a = 1;
      local_128 = 0xffffffd8;
      cVar2 = binlog::detail::concatenated_tags<char_const(&)[12],int&,int_const&,int_const&,int>
                        ((char (*) [12])in_stack_fffffffffffffe48,
                         (int *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         (int *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe28);
      local_124._data._0_4_ = cVar2._data._0_4_;
      local_124._data[4] = cVar2._data[4];
      in_stack_fffffffffffffe50 = (Session *)mserialize::cx_string<4UL>::data(&local_124);
      in_stack_fffffffffffffe58 = &local_129;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,(char *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe58);
      local_12a = 0;
      local_12b = 0;
      local_12c = 0;
      local_12d = 0;
      local_50._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffe20);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::allocator<char>::~allocator((allocator<char> *)&local_11f);
      std::allocator<char>::~allocator((allocator<char> *)&local_11e);
      std::allocator<char>::~allocator((allocator<char> *)local_11d);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      local_8 = &logSigned<int>::_binlog_sid;
      local_10 = local_50._M_i;
      local_14 = 5;
      in_stack_fffffffffffffe38 = &logSigned<int>::_binlog_sid;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10;
      in_stack_fffffffffffffe44 = local_14;
      if (local_14 == 3) {
        (in_stack_fffffffffffffe38->super___atomic_base<unsigned_long>)._M_i = local_10;
      }
      else if (local_14 == 5) {
        LOCK();
        (in_stack_fffffffffffffe38->super___atomic_base<unsigned_long>)._M_i = local_10;
        UNLOCK();
      }
      else {
        (in_stack_fffffffffffffe38->super___atomic_base<unsigned_long>)._M_i = local_10;
      }
    }
    pSVar3 = binlog::default_thread_local_writer();
    clock._M_i = local_50._M_i;
    binlog::clockNow();
    local_134 = -0x28;
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[12],int&,int_const&,int_const&,int>
              ((SessionWriter *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (uint64_t)in_stack_fffffffffffffe38,clock._M_i,(char (*) [12])pSVar3,&local_134,
               local_48,(int *)in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe58);
  }
  return;
}

Assistant:

void logSigned()
{
  T a = -20;
  const T b = 30;
  const T& c = b;
  BINLOG_INFO("{} {} {} {}", a, b, c, T(-40));
}